

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

bool __thiscall OpenMesh::IO::_PLYReader_::can_u_read(_PLYReader_ *this,istream *_is)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  mostream *pmVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  ValueType VVar8;
  long lVar9;
  undefined8 uVar10;
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  *this_00;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  _Alloc_hider _Var15;
  bool bVar16;
  _Alloc_hider _Var17;
  pointer pcVar18;
  string local_238;
  string local_218;
  string local_1f8;
  size_type *psStack_1d0;
  float version;
  string listIndexType;
  string listEntryType;
  undefined1 local_180 [16];
  uint *local_170;
  uint *local_168;
  size_type *local_160;
  string keyword;
  string propertyName;
  string elementName;
  string fileType;
  string tmp2;
  string line;
  string tmp1;
  undefined1 local_70 [8];
  VertexPropertyInfo entry;
  uint local_34;
  
  (this->options_).flags_ = 0;
  this_00 = &this->vertexPropertyMap_;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>,_std::_Select1st<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  ::clear(&this_00->_M_t);
  this->vertexPropertyCount_ = 0;
  tmp2.field_2._8_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)_is + -0x18) + (char)_is);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (_is,(string *)(tmp2.field_2._M_local_buf + 8),cVar2);
  uVar13 = tmp2.field_2._8_8_;
  _Var17 = line._M_dataplus;
  tmp1.field_2._8_8_ = _is;
  if (0 < (long)line._M_dataplus._M_p >> 2) {
    _Var17._M_p = (pointer)(ulong)((uint)line._M_dataplus._M_p & 3);
    lVar9 = ((long)line._M_dataplus._M_p >> 2) + 1;
    _Var15 = line._M_dataplus;
    do {
      iVar3 = isspace((int)_Var15._M_p[uVar13 + -1]);
      if (iVar3 == 0) {
        uVar10 = _Var15._M_p + uVar13;
        goto LAB_0017ae1a;
      }
      iVar3 = isspace((int)_Var15._M_p[uVar13 + -2]);
      if (iVar3 == 0) {
        uVar10 = _Var15._M_p + uVar13 + -1;
        goto LAB_0017ae1a;
      }
      iVar3 = isspace((int)_Var15._M_p[uVar13 + -3]);
      if (iVar3 == 0) {
        uVar10 = _Var15._M_p + uVar13 + -2;
        goto LAB_0017ae1a;
      }
      iVar3 = isspace((int)_Var15._M_p[uVar13 + -4]);
      if (iVar3 == 0) {
        uVar10 = _Var15._M_p + uVar13 + -3;
        goto LAB_0017ae1a;
      }
      _Var15._M_p = _Var15._M_p + -4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  pcVar18 = _Var17._M_p + uVar13;
  lVar9 = (long)pcVar18 - uVar13;
  if (lVar9 == 1) {
LAB_0017ade8:
    iVar3 = isspace((int)pcVar18[-1]);
    uVar10 = pcVar18;
    if (iVar3 != 0) {
      uVar10 = uVar13;
    }
  }
  else if (lVar9 == 2) {
LAB_0017add4:
    iVar3 = isspace((int)pcVar18[-1]);
    uVar10 = pcVar18;
    if (iVar3 != 0) {
      pcVar18 = pcVar18 + -1;
      goto LAB_0017ade8;
    }
  }
  else {
    uVar10 = uVar13;
    if ((lVar9 == 3) && (iVar3 = isspace((int)pcVar18[-1]), uVar10 = pcVar18, iVar3 != 0)) {
      pcVar18 = pcVar18 + -1;
      goto LAB_0017add4;
    }
  }
LAB_0017ae1a:
  uVar1 = tmp2.field_2._8_8_;
  line._M_dataplus._M_p = (pointer)(uVar10 + -uVar13);
  *(char *)uVar10 = '\0';
  pcVar12 = line._M_dataplus._M_p + tmp2.field_2._8_8_;
  uVar13 = tmp2.field_2._8_8_;
  if (0 < (long)line._M_dataplus._M_p >> 2) {
    uVar13 = ((ulong)line._M_dataplus._M_p & 0xfffffffffffffffc) + tmp2.field_2._8_8_;
    lVar9 = ((long)line._M_dataplus._M_p >> 2) + 1;
    pcVar11 = (char *)(tmp2.field_2._8_8_ + 3);
    do {
      iVar3 = isspace((int)pcVar11[-3]);
      if (iVar3 == 0) {
        uVar10 = tmp1.field_2._8_8_;
        pcVar11 = pcVar11 + -3;
        goto LAB_0017af11;
      }
      iVar3 = isspace((int)pcVar11[-2]);
      if (iVar3 == 0) {
        uVar10 = tmp1.field_2._8_8_;
        pcVar11 = pcVar11 + -2;
        goto LAB_0017af11;
      }
      iVar3 = isspace((int)pcVar11[-1]);
      if (iVar3 == 0) {
        uVar10 = tmp1.field_2._8_8_;
        pcVar11 = pcVar11 + -1;
        goto LAB_0017af11;
      }
      iVar3 = isspace((int)*pcVar11);
      uVar10 = tmp1.field_2._8_8_;
      if (iVar3 == 0) goto LAB_0017af11;
      lVar9 = lVar9 + -1;
      pcVar11 = pcVar11 + 4;
    } while (1 < lVar9);
  }
  uVar10 = tmp1.field_2._8_8_;
  lVar9 = (long)pcVar12 - uVar13;
  if (lVar9 == 1) {
LAB_0017aefe:
    iVar3 = isspace((int)*(char *)uVar13);
    pcVar11 = (char *)uVar13;
    if (iVar3 != 0) {
      pcVar11 = pcVar12;
    }
LAB_0017af11:
    if (pcVar12 == pcVar11) goto LAB_0017af30;
    std::__cxx11::string::_M_erase((ulong)((long)&tmp2.field_2 + 8),0);
  }
  else {
    if (lVar9 == 2) {
LAB_0017aed2:
      iVar3 = isspace((int)*(char *)uVar13);
      pcVar11 = (char *)uVar13;
      if (iVar3 != 0) {
        uVar13 = uVar13 + 1;
        goto LAB_0017aefe;
      }
      goto LAB_0017af11;
    }
    if (lVar9 == 3) {
      iVar3 = isspace((int)*(char *)uVar13);
      pcVar11 = (char *)uVar13;
      if (iVar3 != 0) {
        uVar13 = uVar13 + 1;
        goto LAB_0017aed2;
      }
      goto LAB_0017af11;
    }
LAB_0017af30:
    line._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)uVar1 = 0;
  }
  iVar3 = std::__cxx11::string::compare(tmp2.field_2._M_local_buf + 8);
  if ((iVar3 != 0) &&
     (iVar3 = std::__cxx11::string::compare(tmp2.field_2._M_local_buf + 8), iVar3 != 0)) {
    bVar16 = false;
    goto LAB_0017b1ab;
  }
  this->vertexCount_ = 0;
  this->faceCount_ = 0;
  this->vertexDimension_ = 0;
  local_160 = &keyword._M_string_length;
  keyword._M_dataplus._M_p = (pointer)0x0;
  keyword._M_string_length._0_1_ = 0;
  elementName.field_2._8_8_ = &fileType._M_string_length;
  fileType._M_dataplus._M_p = (pointer)0x0;
  fileType._M_string_length._0_1_ = 0;
  propertyName.field_2._8_8_ = &elementName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&propertyName.field_2 + 8),"");
  keyword.field_2._8_8_ = &propertyName._M_string_length;
  propertyName._M_dataplus._M_p = (pointer)0x0;
  propertyName._M_string_length._0_1_ = 0;
  psStack_1d0 = &listIndexType._M_string_length;
  listIndexType._M_dataplus._M_p = (pointer)0x0;
  listIndexType._M_string_length._0_1_ = 0;
  listIndexType.field_2._8_8_ = &listEntryType._M_string_length;
  listEntryType._M_dataplus._M_p = (pointer)0x0;
  listEntryType._M_string_length._0_1_ = 0;
  std::operator>>((istream *)uVar10,(string *)&local_160);
  std::operator>>((istream *)uVar10,(string *)(elementName.field_2._M_local_buf + 8));
  std::istream::_M_extract<float>((float *)uVar10);
  if (((byte)*(istream *)(uVar10 + *(long *)(*(long *)uVar10 + -0x18) + 0x20) & 1) == 0) {
    iVar3 = std::__cxx11::string::compare(elementName.field_2._M_local_buf + 8);
    if (iVar3 == 0) {
      uVar4 = (this->options_).flags_ & 0xfffffffe;
    }
    else {
      iVar3 = std::__cxx11::string::compare(elementName.field_2._M_local_buf + 8);
      if (iVar3 == 0) {
        uVar4 = (this->options_).flags_ | 5;
      }
      else {
        iVar3 = std::__cxx11::string::compare(elementName.field_2._M_local_buf + 8);
        if (iVar3 != 0) {
          pmVar5 = omerr();
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pmVar5->super_ostream,"Unsupported PLY format: ",0x18);
          pmVar5 = (mostream *)
                   std::__ostream_insert<char,std::char_traits<char>>
                             (&pmVar5->super_ostream,(char *)elementName.field_2._8_8_,
                              (long)fileType._M_dataplus._M_p);
          std::ios::widen((char)(pmVar5->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar5);
          goto LAB_0017b10c;
        }
        uVar4 = (this->options_).flags_ | 3;
      }
    }
    (this->options_).flags_ = uVar4;
    lVar9 = std::istream::tellg();
    std::operator>>((istream *)uVar10,(string *)&local_160);
    iVar3 = std::__cxx11::string::compare((char *)&local_160);
    if (iVar3 != 0) {
      local_170 = &this->vertexCount_;
      local_168 = &this->faceCount_;
      do {
        iVar3 = std::__cxx11::string::compare((char *)&local_160);
        if (iVar3 == 0) {
          cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)uVar10 + -0x18) + (char)uVar10);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)uVar10,(string *)(tmp2.field_2._M_local_buf + 8),cVar2);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_160);
          if (iVar3 == 0) {
            std::operator>>((istream *)uVar10,(string *)(propertyName.field_2._M_local_buf + 8));
            iVar3 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
            if ((iVar3 != 0) &&
               (iVar3 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8),
               iVar3 != 0)) {
              pmVar5 = omerr();
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pmVar5->super_ostream,"PLY header unsupported element type: ",0x25);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (&pmVar5->super_ostream,(char *)propertyName.field_2._8_8_,
                                  (long)elementName._M_dataplus._M_p);
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
              goto LAB_0017b3a0;
            }
            std::istream::_M_extract<unsigned_int>((uint *)uVar10);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_160);
            if (iVar3 == 0) {
              line.field_2._8_8_ = &tmp1._M_string_length;
              tmp1._M_dataplus._M_p = (pointer)0x0;
              tmp1._M_string_length._0_1_ = 0;
              fileType.field_2._8_8_ = &tmp2._M_string_length;
              tmp2._M_dataplus._M_p = (pointer)0x0;
              tmp2._M_string_length._0_1_ = 0;
              std::operator>>((istream *)uVar10,(string *)(line.field_2._M_local_buf + 8));
              iVar3 = std::__cxx11::string::compare(line.field_2._M_local_buf + 8);
              if (iVar3 == 0) {
                iVar3 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
                if (iVar3 == 0) {
                  pmVar5 = omerr();
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&pmVar5->super_ostream,"List type not supported for vertices!",0x25);
                  std::ios::widen((char)(pmVar5->super_ostream)._vptr_basic_ostream[-3] +
                                  (char)pmVar5);
LAB_0017b8d6:
                  std::ostream::put((char)pmVar5);
                  std::ostream::flush();
                  goto LAB_0017ba02;
                }
                iVar3 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
                if (iVar3 != 0) goto LAB_0017ba02;
                std::operator>>((istream *)uVar10,(string *)&stack0xfffffffffffffe30);
                std::operator>>((istream *)uVar10,(string *)(listIndexType.field_2._M_local_buf + 8)
                               );
                std::operator>>((istream *)uVar10,(string *)(keyword.field_2._M_local_buf + 8));
                pcVar12 = (char *)&stack0xfffffffffffffe30;
                iVar3 = std::__cxx11::string::compare(pcVar12);
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  VVar8 = ValueTypeUCHAR;
                  if (iVar3 == 0) goto LAB_0017ba7b;
                  pmVar5 = omerr();
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&pmVar5->super_ostream,"Unsupported Index type for face list: ",0x26);
LAB_0017c050:
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (&pmVar5->super_ostream,*(char **)pcVar12,
                                      *(long *)(pcVar12 + 8));
                  std::endl<char,std::char_traits<char>>(poVar6);
                  if ((size_type *)fileType.field_2._8_8_ != &tmp2._M_string_length) {
                    operator_delete((void *)fileType.field_2._8_8_);
                  }
                  if ((size_type *)line.field_2._8_8_ != &tmp1._M_string_length) {
                    operator_delete((void *)line.field_2._8_8_);
                  }
                  goto LAB_0017b11f;
                }
                VVar8 = ValueTypeUINT8;
LAB_0017ba7b:
                this->faceIndexType_ = VVar8;
                pcVar12 = listIndexType.field_2._M_local_buf + 8;
                iVar3 = std::__cxx11::string::compare(pcVar12);
                if (iVar3 == 0) {
                  this->faceEntryType_ = ValueTypeINT32;
                }
                else {
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if (iVar3 == 0) {
                    this->faceEntryType_ = ValueTypeINT;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare(pcVar12);
                    if (iVar3 == 0) {
                      this->faceEntryType_ = ValueTypeUINT32;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare(pcVar12);
                      if (iVar3 != 0) {
                        pmVar5 = omerr();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&pmVar5->super_ostream,"Unsupported Entry type for face list: ",
                                   0x26);
                        pcVar12 = listIndexType.field_2._M_local_buf + 8;
                        goto LAB_0017c050;
                      }
                      this->faceEntryType_ = ValueTypeUINT;
                    }
                  }
                }
              }
              else {
                std::operator>>((istream *)uVar10,(string *)(fileType.field_2._M_local_buf + 8));
                iVar3 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
                  if (iVar3 == 0) {
                    pmVar5 = omerr();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pmVar5->super_ostream,"Properties not supported for faces ",0x23);
                    std::ios::widen((char)(pmVar5->super_ostream)._vptr_basic_ostream[-3] +
                                    (char)pmVar5);
                    goto LAB_0017b8d6;
                  }
                  goto LAB_0017ba02;
                }
                listEntryType.field_2._8_8_ = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)((long)&listEntryType.field_2 + 8),line.field_2._8_8_,
                           tmp1._M_dataplus._M_p + line.field_2._8_8_);
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_238,fileType.field_2._8_8_,
                           tmp2._M_dataplus._M_p + fileType.field_2._8_8_);
                entry.name.field_2._12_4_ =
                     get_property_type((string *)((long)&listEntryType.field_2 + 8),&local_238);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  operator_delete(local_238._M_dataplus._M_p);
                }
                if ((undefined1 *)listEntryType.field_2._8_8_ != local_180) {
                  operator_delete((void *)listEntryType.field_2._8_8_);
                }
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_218,line.field_2._8_8_,
                           tmp1._M_dataplus._M_p + line.field_2._8_8_);
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1f8,fileType.field_2._8_8_,
                           tmp2._M_dataplus._M_p + fileType.field_2._8_8_);
                get_property_name((string *)local_70,&local_218,&local_1f8);
                std::__cxx11::string::operator=
                          ((string *)(keyword.field_2._M_local_buf + 8),(string *)local_70);
                if ((string *)CONCAT44(local_70._4_4_,local_70._0_4_) != &entry.name) {
                  operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p);
                }
                pcVar12 = keyword.field_2._M_local_buf + 8;
                iVar3 = std::__cxx11::string::compare(pcVar12);
                if (iVar3 == 0) {
                  local_70._0_4_ = 0;
                  local_70._4_4_ = entry.name.field_2._12_4_;
                  entry._0_8_ = &entry.name._M_string_length;
                  entry.name._M_dataplus._M_p = (pointer)0x0;
                  entry.name._M_string_length._0_1_ = 0;
                  local_34 = this->vertexPropertyCount_;
                  pmVar7 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](this_00,(key_type *)&local_34);
                  pmVar7->property = local_70._0_4_;
                  pmVar7->value = local_70._4_4_;
                  std::__cxx11::string::_M_assign((string *)&pmVar7->name);
LAB_0017b9e2:
                  this->vertexDimension_ = this->vertexDimension_ + 1;
LAB_0017b9e9:
                  if ((size_type *)entry._0_8_ != &entry.name._M_string_length) {
                    operator_delete((void *)entry._0_8_);
                  }
                }
                else {
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if (iVar3 == 0) {
                    local_70._0_4_ = 1;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                    goto LAB_0017b9e2;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if (iVar3 == 0) {
                    local_70._0_4_ = 2;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                    goto LAB_0017b9e2;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if (iVar3 == 0) {
                    local_70._0_4_ = 9;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
LAB_0017bc6c:
                    *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x10;
                    goto LAB_0017b9e9;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if (iVar3 == 0) {
                    local_70._0_4_ = 10;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                    goto LAB_0017bc6c;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if (iVar3 == 0) {
                    local_70._0_4_ = 0xb;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                    goto LAB_0017bc6c;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare(pcVar12), iVar3 == 0))
                  {
                    local_70._0_4_ = 3;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
LAB_0017bcc8:
                    *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x40;
                    goto LAB_0017b9e9;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare(pcVar12), iVar3 == 0))
                  {
                    local_70._0_4_ = 4;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                    goto LAB_0017bcc8;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  uVar14 = entry.name.field_2._12_4_;
                  if (iVar3 == 0) {
                    local_70._0_4_ = 5;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
LAB_0017bd79:
                    (this->options_).flags_ =
                         (uint)(uVar14 - 0xd < 2) << 0xc | (this->options_).flags_ | 0x20;
                    goto LAB_0017b9e9;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  uVar14 = entry.name.field_2._12_4_;
                  if (iVar3 == 0) {
                    local_70._0_4_ = 6;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                    goto LAB_0017bd79;
                  }
                  iVar3 = std::__cxx11::string::compare(pcVar12);
                  uVar14 = entry.name.field_2._12_4_;
                  if (iVar3 == 0) {
                    local_70._0_4_ = 7;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
LAB_0017bef3:
                    uVar4 = (uint)(uVar14 - 0xd < 2) << 0xc | (this->options_).flags_ | 0x20;
LAB_0017bf03:
                    (this->options_).flags_ = uVar4;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare(pcVar12);
                    uVar14 = entry.name.field_2._12_4_;
                    if (iVar3 == 0) {
                      local_70._0_4_ = 5;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar7 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar7->property = local_70._0_4_;
                      pmVar7->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                      goto LAB_0017bef3;
                    }
                    iVar3 = std::__cxx11::string::compare(pcVar12);
                    if (iVar3 == 0) {
                      local_70._0_4_ = 6;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar7 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar7->property = local_70._0_4_;
                      pmVar7->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                      uVar14 = entry.name.field_2._12_4_;
                      goto LAB_0017bef3;
                    }
                    iVar3 = std::__cxx11::string::compare(pcVar12);
                    if (iVar3 == 0) {
                      local_70._0_4_ = 7;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar7 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar7->property = local_70._0_4_;
                      pmVar7->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                      uVar14 = entry.name.field_2._12_4_;
                      goto LAB_0017bef3;
                    }
                    iVar3 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8);
                    if (iVar3 == 0) {
                      local_70._0_4_ = 8;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar7 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar7->property = local_70._0_4_;
                      pmVar7->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                      uVar4 = (uint)(entry.name.field_2._12_4_ - 0xd < 2) << 0xc |
                              (this->options_).flags_ | 0x820;
                      goto LAB_0017bf03;
                    }
                    uVar4 = (this->options_).flags_;
                    if ((uVar4 & 1) == 0) {
                      (this->options_).flags_ = uVar4 | 0x2000;
                    }
                    local_70._0_4_ = uVar4 & 1 | 0xc;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&entry,keyword.field_2._8_8_,
                               propertyName._M_dataplus._M_p + keyword.field_2._8_8_);
                    local_34 = this->vertexPropertyCount_;
                    pmVar7 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar7->property = local_70._0_4_;
                    pmVar7->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar7->name);
                  }
                  uVar10 = tmp1.field_2._8_8_;
                  if ((size_type *)entry._0_8_ != &entry.name._M_string_length) {
                    operator_delete((void *)entry._0_8_);
                    uVar10 = tmp1.field_2._8_8_;
                  }
                }
                this->vertexPropertyCount_ = this->vertexPropertyCount_ + 1;
              }
LAB_0017ba02:
              if ((size_type *)fileType.field_2._8_8_ != &tmp2._M_string_length) {
                operator_delete((void *)fileType.field_2._8_8_);
              }
              if ((size_type *)line.field_2._8_8_ != &tmp1._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
            }
            else {
              pmVar5 = omlog();
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pmVar5->super_ostream,"Unsupported keyword : ",0x16);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (&pmVar5->super_ostream,(char *)local_160,
                                  (long)keyword._M_dataplus._M_p);
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
LAB_0017b3a0:
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
          }
        }
        lVar9 = std::istream::tellg();
        std::operator>>((istream *)uVar10,(string *)&local_160);
        if (((byte)*(istream *)(uVar10 + *(long *)(*(long *)uVar10 + -0x18) + 0x20) & 1) != 0) {
          pmVar5 = omerr();
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pmVar5->super_ostream,"Error while reading PLY file header",0x23);
          std::ios::widen((char)(pmVar5->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar5);
          std::ostream::put((char)pmVar5);
          std::ostream::flush();
          goto LAB_0017b11f;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_160);
      } while (iVar3 != 0);
    }
    bVar16 = true;
    if (((this->options_).flags_ & 1) != 0) {
      std::istream::seekg(uVar10,lVar9 + 0xc,0);
    }
  }
  else {
    pmVar5 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar5->super_ostream,"Defect PLY header detected",0x1a);
    std::ios::widen((char)(pmVar5->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar5);
LAB_0017b10c:
    std::ostream::put((char)pmVar5);
    std::ostream::flush();
LAB_0017b11f:
    bVar16 = false;
  }
  if ((size_type *)listIndexType.field_2._8_8_ != &listEntryType._M_string_length) {
    operator_delete((void *)listIndexType.field_2._8_8_);
  }
  if (psStack_1d0 != &listIndexType._M_string_length) {
    operator_delete(psStack_1d0);
  }
  if ((size_type *)keyword.field_2._8_8_ != &propertyName._M_string_length) {
    operator_delete((void *)keyword.field_2._8_8_);
  }
  if ((size_type *)propertyName.field_2._8_8_ != &elementName._M_string_length) {
    operator_delete((void *)propertyName.field_2._8_8_);
  }
  if ((size_type *)elementName.field_2._8_8_ != &fileType._M_string_length) {
    operator_delete((void *)elementName.field_2._8_8_);
  }
  if (local_160 != &keyword._M_string_length) {
    operator_delete(local_160);
  }
LAB_0017b1ab:
  if ((size_type *)tmp2.field_2._8_8_ != &line._M_string_length) {
    operator_delete((void *)tmp2.field_2._8_8_);
  }
  return bVar16;
}

Assistant:

bool _PLYReader_::can_u_read(std::istream& _is) const {

    // Clear per file options
    options_.cleanup();

    // clear vertex property map, will be recreated
    vertexPropertyMap_.clear();
    vertexPropertyCount_ = 0;

    // read 1st line
    std::string line;
    std::getline(_is, line);
    trim(line);

    //Check if this file is really a ply format
    if (line != "PLY" && line != "ply")
        return false;

    vertexCount_ = 0;
    faceCount_ = 0;
    vertexDimension_ = 0;

    std::string keyword;
    std::string fileType;
    std::string elementName = "";
    std::string propertyName;
    std::string listIndexType;
    std::string listEntryType;
    float version;

    _is >> keyword;
    _is >> fileType;
    _is >> version;

    if (_is.bad()) {
        omerr() << "Defect PLY header detected" << std::endl;
        return false;
    }

    if (fileType == "ascii") {
        options_ -= Options::Binary;
    } else if (fileType == "binary_little_endian") {
        options_ += Options::Binary;
        options_ += Options::LSB;
        //if (Endian::local() == Endian::MSB)

        //  options_ += Options::Swap;
    } else if (fileType == "binary_big_endian") {
        options_ += Options::Binary;
        options_ += Options::MSB;
        //if (Endian::local() == Endian::LSB)

        //  options_ += Options::Swap;
    } else {
        omerr() << "Unsupported PLY format: " << fileType << std::endl;
        return false;
    }

    std::streamoff streamPos = _is.tellg();
    _is >> keyword;
    while (keyword != "end_header") {

        if (keyword == "comment") {
            std::getline(_is, line);
        } else if (keyword == "element") {
            _is >> elementName;
            if (elementName == "vertex") {
                _is >> vertexCount_;
            } else if (elementName == "face") {
                _is >> faceCount_;
            } else {
                omerr() << "PLY header unsupported element type: " << elementName << std::endl;
            }
        } else if (keyword == "property") {
            std::string tmp1;
            std::string tmp2;

            // Read first keyword, as it might be a list
            _is >> tmp1;

            if (tmp1 == "list") {
                if (elementName == "vertex") {
                    omerr() << "List type not supported for vertices!" << std::endl;
                } else if (elementName == "face") {
                    _is >> listIndexType;
                    _is >> listEntryType;
                    _is >> propertyName;

                    if (listIndexType == "uint8") {
                        faceIndexType_ = ValueTypeUINT8;
                    } else if (listIndexType == "uchar") {
                        faceIndexType_ = ValueTypeUCHAR;
                    } else {
                        omerr() << "Unsupported Index type for face list: " << listIndexType << std::endl;
                        return false;
                    }

                    if (listEntryType == "int32") {
                        faceEntryType_ = ValueTypeINT32;
                    } else if (listEntryType == "int") {
                        faceEntryType_ = ValueTypeINT;
                    } else if (listEntryType == "uint32") {
                        faceEntryType_ = ValueTypeUINT32;
                    } else if (listEntryType == "uint") {
                        faceEntryType_ = ValueTypeUINT;
                    } else {
                        omerr() << "Unsupported Entry type for face list: " << listEntryType << std::endl;
                        return false;
                    }

                }
            } else {
                // as this is not a list property, read second value of property
                _is >> tmp2;

                if (elementName == "vertex") {
                    // Extract name and type of property
                    // As the order seems to be different in some files, autodetect it.
                    ValueType valueType = get_property_type(tmp1, tmp2);
                    propertyName = get_property_name(tmp1, tmp2);

                    if (propertyName == "x") {
                      VertexPropertyInfo entry(XCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "y") {
                      VertexPropertyInfo entry(YCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "z") {
                      VertexPropertyInfo entry(ZCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "nx") {
                      VertexPropertyInfo entry(XNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "ny") {
                      VertexPropertyInfo entry(YNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "nz") {
                      VertexPropertyInfo entry(ZNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "u" || propertyName == "s") {
                      VertexPropertyInfo entry(TEXX, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "v" || propertyName == "t") {
                      VertexPropertyInfo entry(TEXY, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "alpha") {
                      VertexPropertyInfo entry(COLORALPHA, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      options_ += Options::ColorAlpha;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else {
                      VertexProperty prop = (!options_.is_binary()) ? CUSTOM_PROP : UNSUPPORTED; // loading vertex properties is not yet supported by the binary loader
                      if (prop != UNSUPPORTED)
                        options_ += Options::Custom;
                      VertexPropertyInfo entry(prop, valueType, propertyName);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                    }

                    vertexPropertyCount_++;

                } else if (elementName == "face") {
                    omerr() << "Properties not supported for faces " << std::endl;
                }

            }

        } else {
            omlog() << "Unsupported keyword : " << keyword << std::endl;
        }

        streamPos = _is.tellg();
        _is >> keyword;
        if (_is.bad()) {
            omerr() << "Error while reading PLY file header" << std::endl;
            return false;
        }
    }

    // As the binary data is directy after the end_header keyword
    // and the stream removes too many bytes, seek back to the right position
    if (options_.is_binary()) {
        _is.seekg(streamPos + 12);
    }

    return true;
}